

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void rdr_loadpat(rdr_t *rdr,FILE *file)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  char *__s;
  size_t sVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  pat_t *ppVar10;
  pat_t **pppVar11;
  long lVar12;
  
LAB_0010bbad:
  do {
    iVar5 = feof((FILE *)file);
    if (iVar5 != 0) {
      return;
    }
    __s = rdr_readline(file);
    if (__s == (char *)0x0) {
      return;
    }
    sVar7 = strcspn(__s,"#");
    lVar4 = (long)(int)sVar7;
    do {
      lVar12 = lVar4;
      if (lVar12 == 0) {
        free(__s);
        goto LAB_0010bbad;
      }
      ppuVar8 = __ctype_b_loc();
      lVar4 = lVar12 + -1;
    } while ((*(byte *)((long)*ppuVar8 + (long)__s[lVar12 + -1] * 2 + 1) & 0x20) != 0);
    __s[lVar12] = '\0';
    pp_Var9 = __ctype_tolower_loc();
    *__s = (char)(*pp_Var9)[*__s];
    ppVar10 = pat_comp(__s);
    uVar6 = rdr->npats + 1;
    rdr->npats = uVar6;
    cVar3 = *__s;
    if (cVar3 == '*') {
      uVar1 = rdr->nuni;
      uVar2 = rdr->nbi;
      rdr->nuni = uVar1 + 1;
      rdr->nbi = uVar2 + 1;
    }
    else if (cVar3 == 'b') {
      rdr->nbi = rdr->nbi + 1;
    }
    else {
      if (cVar3 != 'u') {
        fatal("unknown pattern type \'%c\'",(ulong)(uint)(int)cVar3);
      }
      rdr->nuni = rdr->nuni + 1;
    }
    pppVar11 = (pat_t **)xrealloc(rdr->pats,(ulong)uVar6 << 3);
    rdr->pats = pppVar11;
    pppVar11[rdr->npats - 1] = ppVar10;
    uVar6 = ppVar10->ntoks;
    if (ppVar10->ntoks < rdr->ntoks) {
      uVar6 = rdr->ntoks;
    }
    rdr->ntoks = uVar6;
  } while( true );
}

Assistant:

void rdr_loadpat(rdr_t *rdr, FILE *file) {
	while (!feof(file)) {
		// Read raw input line
		char *line = rdr_readline(file);
		if (line == NULL)
			break;
		// Remove comments and trailing spaces
		int end = strcspn(line, "#");
		while (end != 0 && isspace(line[end - 1]))
			end--;
		if (end == 0) {
			free(line);
			continue;
		}
		line[end] = '\0';
		line[0] = tolower(line[0]);
		// Compile pattern and add it to the list
		pat_t *pat = pat_comp(line);
		rdr->npats++;
		switch (line[0]) {
			case 'u': rdr->nuni++; break;
			case 'b': rdr->nbi++; break;
			case '*': rdr->nuni++;
			          rdr->nbi++; break;
			default:
				fatal("unknown pattern type '%c'", line[0]);
		}
		rdr->pats = xrealloc(rdr->pats, sizeof(char *) * rdr->npats);
		rdr->pats[rdr->npats - 1] = pat;
		rdr->ntoks = max(rdr->ntoks, pat->ntoks);
	}
}